

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall yy::parser::symbol_type::symbol_type(symbol_type *this,int tok,location_type l)

{
  bool bVar1;
  int tok_local;
  symbol_type *this_local;
  
  basic_symbol<yy::parser::by_kind>::basic_symbol
            (&this->super_basic_symbol<yy::parser::by_kind>,tok,&l);
  bVar1 = true;
  if ((((tok != 0) && ((tok < 1 || (bVar1 = true, 6 < tok)))) &&
      ((tok < 8 || (bVar1 = true, 10 < tok)))) && ((tok < 0xc || (bVar1 = true, 0xd < tok)))) {
    bVar1 = tok == 0xf;
  }
  if (!bVar1) {
    __assert_fail("tok == token::YYEOF || (token::YYerror <= tok && tok <= token::SPACES) || (token::OPEN_PAREN <= tok && tok <= token::LINE_COMMENT) || (token::BRACKET_COMMENT <= tok && tok <= token::DOUBLE_QUOTE) || tok == token::REF_CLOSE"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.h"
                  ,0x34e,"yy::parser::symbol_type::symbol_type(int, location_type)");
  }
  return;
}

Assistant:

symbol_type (int tok, const location_type& l)
        : super_type (token_kind_type (tok), l)
#endif
      {
#if !defined _MSC_VER || defined __clang__
        YY_ASSERT (tok == token::YYEOF
                   || (token::YYerror <= tok && tok <= token::SPACES)
                   || (token::OPEN_PAREN <= tok && tok <= token::LINE_COMMENT)
                   || (token::BRACKET_COMMENT <= tok && tok <= token::DOUBLE_QUOTE)
                   || tok == token::REF_CLOSE);
#endif
      }